

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JSONValue.cpp
# Opt level: O2

wstring * __thiscall
JSONValue::StringifyImpl_abi_cxx11_
          (wstring *__return_storage_ptr__,JSONValue *this,size_t indentDepth)

{
  wstring *pwVar1;
  _Rb_tree_node_base *p_Var2;
  size_t depth;
  pointer ppJVar3;
  JSONValue *this_00;
  size_t sVar4;
  wstring indentStr1;
  wstring indentStr;
  wstringstream ss;
  allocator local_221;
  size_t local_220;
  basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_> local_218;
  wstring local_1f8;
  wstring local_1d8;
  wstring local_1b8 [12];
  
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = L'\0';
  this_00 = (JSONValue *)(indentDepth + 1);
  if (indentDepth == 0) {
    this_00 = (JSONValue *)0x0;
  }
  Indent_abi_cxx11_(&local_1d8,(JSONValue *)indentDepth,indentDepth);
  Indent_abi_cxx11_(&local_1f8,this_00,depth);
  switch(this->type) {
  case JSONType_Null:
    break;
  case JSONType_String:
    StringifyString(local_1b8,(this->field_1).string_value);
    pwVar1 = local_1b8;
    std::__cxx11::wstring::operator=((wstring *)__return_storage_ptr__,(wstring *)pwVar1);
    goto LAB_0017a5ab;
  case JSONType_Bool:
    break;
  case JSONType_Number:
    if (((ulong)(this->field_1).string_value & 0x7fffffffffffffff) < 0x7ff0000000000000) {
      std::__cxx11::wstringstream::wstringstream((wstringstream *)local_1b8);
      *(undefined8 *)
       ((long)&local_1b8[0]._M_string_length + *(long *)(local_1b8[0]._M_dataplus._M_p + -6)) = 0xf;
      std::wostream::_M_insert<double>((this->field_1).number_value);
      std::__cxx11::wstringbuf::str();
      std::__cxx11::wstring::operator=((wstring *)__return_storage_ptr__,(wstring *)&local_218);
      std::__cxx11::wstring::~wstring((wstring *)&local_218);
      std::__cxx11::wstringstream::~wstringstream((wstringstream *)local_1b8);
      goto switchD_0017a25f_default;
    }
    break;
  case JSONType_Array:
    if (indentDepth == 0) {
      std::__cxx11::wstring::wstring((wstring *)local_1b8,L"[",&local_221);
    }
    else {
      std::operator+(local_1b8,L"[\n",&local_1f8);
    }
    std::__cxx11::wstring::operator=((wstring *)__return_storage_ptr__,(wstring *)local_1b8);
    std::__cxx11::wstring::~wstring((wstring *)local_1b8);
    pwVar1 = (wstring *)(this->field_1).array_value;
    ppJVar3 = (((_Vector_base<JSONValue_*,_std::allocator<JSONValue_*>_> *)&pwVar1->_M_dataplus)->
              _M_impl).super__Vector_impl_data._M_start;
    local_220 = indentDepth;
    while (sVar4 = local_220, ppJVar3 != (pointer)pwVar1->_M_string_length) {
      StringifyImpl_abi_cxx11_(local_1b8,*ppJVar3,(size_t)this_00);
      std::__cxx11::wstring::append((wstring *)__return_storage_ptr__);
      std::__cxx11::wstring::~wstring((wstring *)local_1b8);
      ppJVar3 = ppJVar3 + 1;
      pwVar1 = (this->field_1).string_value;
      if (ppJVar3 != (pointer)pwVar1->_M_string_length) {
        std::__cxx11::wstring::append((wchar_t *)__return_storage_ptr__);
        pwVar1 = (this->field_1).string_value;
      }
    }
    if (local_220 == 0) {
      std::__cxx11::wstring::wstring((wstring *)local_1b8,L"]",(allocator *)&local_218);
    }
    else {
      std::operator+(&local_218,L"\n",&local_1d8);
      std::operator+(local_1b8,&local_218,L"]");
    }
    std::__cxx11::wstring::append((wstring *)__return_storage_ptr__);
    goto LAB_0017a597;
  case JSONType_Object:
    if (indentDepth == 0) {
      std::__cxx11::wstring::wstring((wstring *)local_1b8,L"{",&local_221);
    }
    else {
      std::operator+(local_1b8,L"{\n",&local_1f8);
    }
    std::__cxx11::wstring::operator=((wstring *)__return_storage_ptr__,(wstring *)local_1b8);
    std::__cxx11::wstring::~wstring((wstring *)local_1b8);
    pwVar1 = (this->field_1).string_value;
    p_Var2 = *(_Rb_tree_node_base **)((long)&pwVar1->field_2 + 8);
    local_220 = indentDepth;
    while (sVar4 = local_220, p_Var2 != (_Rb_tree_node_base *)&pwVar1->_M_string_length) {
      StringifyString(local_1b8,(wstring *)(p_Var2 + 1));
      std::__cxx11::wstring::append((wstring *)__return_storage_ptr__);
      std::__cxx11::wstring::~wstring((wstring *)local_1b8);
      std::__cxx11::wstring::append((wchar_t *)__return_storage_ptr__);
      StringifyImpl_abi_cxx11_(local_1b8,*(JSONValue **)(p_Var2 + 2),(size_t)this_00);
      std::__cxx11::wstring::append((wstring *)__return_storage_ptr__);
      std::__cxx11::wstring::~wstring((wstring *)local_1b8);
      p_Var2 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var2);
      pwVar1 = (this->field_1).string_value;
      if (p_Var2 != (_Rb_tree_node_base *)&pwVar1->_M_string_length) {
        std::__cxx11::wstring::append((wchar_t *)__return_storage_ptr__);
        pwVar1 = (this->field_1).string_value;
      }
    }
    if (local_220 == 0) {
      std::__cxx11::wstring::wstring((wstring *)local_1b8,L"}",(allocator *)&local_218);
    }
    else {
      std::operator+(&local_218,L"\n",&local_1d8);
      std::operator+(local_1b8,&local_218,L"}");
    }
    std::__cxx11::wstring::append((wstring *)__return_storage_ptr__);
LAB_0017a597:
    std::__cxx11::wstring::~wstring((wstring *)local_1b8);
    if (sVar4 != 0) {
      pwVar1 = &local_218;
LAB_0017a5ab:
      std::__cxx11::wstring::~wstring((wstring *)pwVar1);
    }
  default:
    goto switchD_0017a25f_default;
  }
  std::__cxx11::wstring::assign((wchar_t *)__return_storage_ptr__);
switchD_0017a25f_default:
  std::__cxx11::wstring::~wstring((wstring *)&local_1f8);
  std::__cxx11::wstring::~wstring((wstring *)&local_1d8);
  return __return_storage_ptr__;
}

Assistant:

std::wstring JSONValue::StringifyImpl(size_t const indentDepth) const
{
	std::wstring ret_string;
	size_t const indentDepth1 = indentDepth ? indentDepth + 1 : 0;
	std::wstring const indentStr = Indent(indentDepth);
	std::wstring const indentStr1 = Indent(indentDepth1);

	switch (type)
	{
		case JSONType_Null:
			ret_string = L"null";
			break;

		case JSONType_String:
			ret_string = StringifyString(*string_value);
			break;

		case JSONType_Bool:
			ret_string = bool_value ? L"true" : L"false";
			break;

		case JSONType_Number:
		{
			if (isinf(number_value) || isnan(number_value))
				ret_string = L"null";
			else
			{
				std::wstringstream ss;
				ss.precision(15);
				ss << number_value;
				ret_string = ss.str();
			}
			break;
		}

		case JSONType_Array:
		{
			ret_string = indentDepth ? L"[\n" + indentStr1 : L"[";
			JSONArray::const_iterator iter = array_value->begin();
			while (iter != array_value->end())
			{
				ret_string += (*iter)->StringifyImpl(indentDepth1);

				// Not at the end - add a separator
				if (++iter != array_value->end())
					ret_string += L",";
			}
			ret_string += indentDepth ? L"\n" + indentStr + L"]" : L"]";
			break;
		}

		case JSONType_Object:
		{
			ret_string = indentDepth ? L"{\n" + indentStr1 : L"{";
			JSONObject::const_iterator iter = object_value->begin();
			while (iter != object_value->end())
			{
				ret_string += StringifyString((*iter).first);
				ret_string += L":";
				ret_string += (*iter).second->StringifyImpl(indentDepth1);

				// Not at the end - add a separator
				if (++iter != object_value->end())
					ret_string += L",";
			}
			ret_string += indentDepth ? L"\n" + indentStr + L"}" : L"}";
			break;
		}
	}

	return ret_string;
}